

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateMouseInputs(void)

{
  bool bVar1;
  float fVar2;
  float delta_sqr_click_pos;
  ImVec2 delta_from_click_pos;
  bool is_repeated_click;
  int i;
  ImGuiIO *io;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  float local_50;
  float local_4c;
  bool local_46;
  bool local_45;
  ImVec2 local_44;
  float local_3c;
  ImVec2 local_38;
  byte local_2d;
  int local_2c;
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 local_18;
  ImGuiIO *local_10;
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  local_10 = &GImGui->IO;
  bVar1 = IsMousePosValid(&(GImGui->IO).MousePos);
  if (bVar1) {
    local_18 = ImFloorSigned((ImVec2 *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                            );
    local_8->MouseLastValidPos = local_18;
    local_10->MousePos = local_8->MouseLastValidPos;
  }
  bVar1 = IsMousePosValid(&local_10->MousePos);
  if ((bVar1) && (bVar1 = IsMousePosValid(&local_10->MousePosPrev), bVar1)) {
    local_20 = operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         (ImVec2 *)0x11dbc9);
    local_10->MouseDelta = local_20;
  }
  else {
    ImVec2::ImVec2(&local_28,0.0,0.0);
    local_10->MouseDelta = local_28;
  }
  fVar2 = (local_10->MouseDelta).x;
  if ((((fVar2 != 0.0) || (NAN(fVar2))) || (fVar2 = (local_10->MouseDelta).y, fVar2 != 0.0)) ||
     (NAN(fVar2))) {
    local_8->NavDisableMouseHover = false;
  }
  local_10->MousePosPrev = local_10->MousePos;
  for (local_2c = 0; local_2c < 5; local_2c = local_2c + 1) {
    local_45 = false;
    if ((local_10->MouseDown[local_2c] & 1U) != 0) {
      local_45 = local_10->MouseDownDuration[local_2c] <= 0.0 &&
                 local_10->MouseDownDuration[local_2c] != 0.0;
    }
    local_10->MouseClicked[local_2c] = local_45;
    local_10->MouseClickedCount[local_2c] = 0;
    local_46 = false;
    if ((local_10->MouseDown[local_2c] & 1U) == 0) {
      local_46 = 0.0 <= local_10->MouseDownDuration[local_2c];
    }
    local_10->MouseReleased[local_2c] = local_46;
    local_10->MouseDownDurationPrev[local_2c] = local_10->MouseDownDuration[local_2c];
    if ((local_10->MouseDown[local_2c] & 1U) == 0) {
      local_50 = -1.0;
    }
    else {
      if (0.0 < local_10->MouseDownDuration[local_2c] ||
          local_10->MouseDownDuration[local_2c] == 0.0) {
        local_4c = local_10->MouseDownDuration[local_2c] + local_10->DeltaTime;
      }
      else {
        local_4c = 0.0;
      }
      local_50 = local_4c;
    }
    local_10->MouseDownDuration[local_2c] = local_50;
    if ((local_10->MouseClicked[local_2c] & 1U) == 0) {
      if ((local_10->MouseDown[local_2c] & 1U) != 0) {
        bVar1 = IsMousePosValid(&local_10->MousePos);
        if (bVar1) {
          local_44 = operator-((ImVec2 *)
                               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                               (ImVec2 *)0x11dfa9);
          in_stack_ffffffffffffffac = ImLengthSqr(&local_44);
        }
        else {
          in_stack_ffffffffffffffac = 0.0;
        }
        local_3c = in_stack_ffffffffffffffac;
        fVar2 = ImMax<float>(local_10->MouseDragMaxDistanceSqr[local_2c],in_stack_ffffffffffffffac);
        local_10->MouseDragMaxDistanceSqr[local_2c] = fVar2;
      }
    }
    else {
      local_2d = 0;
      if ((float)(local_8->Time - local_10->MouseClickedTime[local_2c]) <
          local_10->MouseDoubleClickTime) {
        bVar1 = IsMousePosValid(&local_10->MousePos);
        if (bVar1) {
          local_38 = operator-((ImVec2 *)
                               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                               (ImVec2 *)0x11de5c);
        }
        else {
          ImVec2::ImVec2(&local_38,0.0,0.0);
        }
        fVar2 = ImLengthSqr(&local_38);
        if (fVar2 < local_10->MouseDoubleClickMaxDist * local_10->MouseDoubleClickMaxDist) {
          local_2d = 1;
        }
      }
      if ((local_2d & 1) == 0) {
        local_10->MouseClickedLastCount[local_2c] = 1;
      }
      else {
        local_10->MouseClickedLastCount[local_2c] = local_10->MouseClickedLastCount[local_2c] + 1;
      }
      local_10->MouseClickedTime[local_2c] = local_8->Time;
      local_10->MouseClickedPos[local_2c] = local_10->MousePos;
      local_10->MouseClickedCount[local_2c] = local_10->MouseClickedLastCount[local_2c];
      local_10->MouseDragMaxDistanceSqr[local_2c] = 0.0;
    }
    local_10->MouseDoubleClicked[local_2c] = local_10->MouseClickedCount[local_2c] == 2;
    if ((local_10->MouseClicked[local_2c] & 1U) != 0) {
      local_8->NavDisableMouseHover = false;
    }
  }
  return;
}

Assistant:

static void ImGui::UpdateMouseInputs()
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;

    // Round mouse position to avoid spreading non-rounded position (e.g. UpdateManualResize doesn't support them well)
    if (IsMousePosValid(&io.MousePos))
        io.MousePos = g.MouseLastValidPos = ImFloorSigned(io.MousePos);

    // If mouse just appeared or disappeared (usually denoted by -FLT_MAX components) we cancel out movement in MouseDelta
    if (IsMousePosValid(&io.MousePos) && IsMousePosValid(&io.MousePosPrev))
        io.MouseDelta = io.MousePos - io.MousePosPrev;
    else
        io.MouseDelta = ImVec2(0.0f, 0.0f);

    // If mouse moved we re-enable mouse hovering in case it was disabled by gamepad/keyboard. In theory should use a >0.0f threshold but would need to reset in everywhere we set this to true.
    if (io.MouseDelta.x != 0.0f || io.MouseDelta.y != 0.0f)
        g.NavDisableMouseHover = false;

    io.MousePosPrev = io.MousePos;
    for (int i = 0; i < IM_ARRAYSIZE(io.MouseDown); i++)
    {
        io.MouseClicked[i] = io.MouseDown[i] && io.MouseDownDuration[i] < 0.0f;
        io.MouseClickedCount[i] = 0; // Will be filled below
        io.MouseReleased[i] = !io.MouseDown[i] && io.MouseDownDuration[i] >= 0.0f;
        io.MouseDownDurationPrev[i] = io.MouseDownDuration[i];
        io.MouseDownDuration[i] = io.MouseDown[i] ? (io.MouseDownDuration[i] < 0.0f ? 0.0f : io.MouseDownDuration[i] + io.DeltaTime) : -1.0f;
        if (io.MouseClicked[i])
        {
            bool is_repeated_click = false;
            if ((float)(g.Time - io.MouseClickedTime[i]) < io.MouseDoubleClickTime)
            {
                ImVec2 delta_from_click_pos = IsMousePosValid(&io.MousePos) ? (io.MousePos - io.MouseClickedPos[i]) : ImVec2(0.0f, 0.0f);
                if (ImLengthSqr(delta_from_click_pos) < io.MouseDoubleClickMaxDist * io.MouseDoubleClickMaxDist)
                    is_repeated_click = true;
            }
            if (is_repeated_click)
                io.MouseClickedLastCount[i]++;
            else
                io.MouseClickedLastCount[i] = 1;
            io.MouseClickedTime[i] = g.Time;
            io.MouseClickedPos[i] = io.MousePos;
            io.MouseClickedCount[i] = io.MouseClickedLastCount[i];
            io.MouseDragMaxDistanceSqr[i] = 0.0f;
        }
        else if (io.MouseDown[i])
        {
            // Maintain the maximum distance we reaching from the initial click position, which is used with dragging threshold
            float delta_sqr_click_pos = IsMousePosValid(&io.MousePos) ? ImLengthSqr(io.MousePos - io.MouseClickedPos[i]) : 0.0f;
            io.MouseDragMaxDistanceSqr[i] = ImMax(io.MouseDragMaxDistanceSqr[i], delta_sqr_click_pos);
        }

        // We provide io.MouseDoubleClicked[] as a legacy service
        io.MouseDoubleClicked[i] = (io.MouseClickedCount[i] == 2);

        // Clicking any mouse button reactivate mouse hovering which may have been deactivated by gamepad/keyboard navigation
        if (io.MouseClicked[i])
            g.NavDisableMouseHover = false;
    }
}